

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pySRUP_Initiate.cpp
# Opt level: O2

object get_digest(SRUP_MSG_INIT *self)

{
  char *pcVar1;
  PyObject *pPVar2;
  SRUP_MSG_INIT *in_RSI;
  allocator local_31;
  string local_30 [32];
  
  pcVar1 = SRUP_MSG_INIT::digest(in_RSI);
  if (pcVar1 == (char *)0x0) {
    __Py_NoneStruct = __Py_NoneStruct + 1;
    (self->super_SRUP_MSG)._vptr_SRUP_MSG = (_func_int **)&_Py_NoneStruct;
  }
  else {
    std::__cxx11::string::string(local_30,pcVar1,&local_31);
    pPVar2 = boost::python::api::object_initializer_impl<false,false>::get<std::__cxx11::string>
                       (local_30);
    (self->super_SRUP_MSG)._vptr_SRUP_MSG = (_func_int **)pPVar2;
    std::__cxx11::string::~string(local_30);
  }
  return (object)(object_base)self;
}

Assistant:

boost::python::object get_digest(SRUP_MSG_INIT& self)
{
    const char* rv;
    rv = self.digest();

    if (rv != nullptr)
        return boost::python::object(std::string(rv));
    else
        return boost::python::object();
}